

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.cpp
# Opt level: O3

pair<mjs::token,_unsigned_long> * __thiscall
mjs::anon_unknown_2::skip_comment
          (pair<mjs::token,_unsigned_long> *__return_storage_ptr__,anon_unknown_2 *this,
          wstring_view *text,size_t pos,version v)

{
  int iVar1;
  uint uVar2;
  pair<mjs::token,_unsigned_long> *extraout_RAX;
  runtime_error *this_00;
  pair<mjs::token,_unsigned_long> *extraout_RAX_00;
  byte bVar3;
  anon_unknown_2 *paVar4;
  anon_unknown_2 *paVar5;
  bool bVar6;
  bool bVar7;
  token local_40;
  
  if (this <= pos) {
    __assert_fail("pos < text.size()",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                  0x89,
                  "std::pair<token, size_t> mjs::(anonymous namespace)::skip_comment(const std::wstring_view &, size_t, version)"
                 );
  }
  iVar1 = *(int *)((long)&text->_M_len + pos * 4);
  if ((iVar1 != 0x2a) && (iVar1 != 0x2f)) {
    __assert_fail("text[pos] == \'/\' || text[pos] == \'*\'",
                  "/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs/lexer.cpp",
                  0x8a,
                  "std::pair<token, size_t> mjs::(anonymous namespace)::skip_comment(const std::wstring_view &, size_t, version)"
                 );
  }
  paVar4 = (anon_unknown_2 *)(pos + 1);
  if (iVar1 != 0x2f) {
    if (paVar4 < this) {
      bVar3 = 0;
      bVar6 = false;
      paVar4 = (anon_unknown_2 *)(pos + 2);
      do {
        uVar2 = *(uint *)((long)text + (long)paVar4 * 4 + -4);
        if (!(bool)(~bVar6 & 1) && uVar2 == 0x2f) {
          local_40.type_ = (token_type)bVar3;
          (__return_storage_ptr__->first).type_ = eof;
          token::operator=(&__return_storage_ptr__->first,&local_40);
          __return_storage_ptr__->second = (unsigned_long)paVar4;
          token::destroy(&local_40);
          return extraout_RAX_00;
        }
        bVar6 = uVar2 == 0x2a;
        if (((uVar2 == 10) || (uVar2 == 0xd)) || ((v != es1 && ((uVar2 & 0xfffffffe) == 0x2028)))) {
          bVar3 = 1;
        }
        bVar7 = paVar4 != this;
        paVar4 = paVar4 + 1;
      } while (bVar7);
    }
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Unterminated multi-line comment");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  paVar5 = paVar4;
  if (paVar4 < this) {
    while ((uVar2 = *(uint *)((long)&text->_M_len + (long)paVar4 * 4), paVar5 = paVar4, uVar2 != 10
           && (uVar2 != 0xd))) {
      if (((v != es1) && ((uVar2 & 0xfffffffe) == 0x2028)) ||
         (paVar4 = paVar4 + 1, paVar5 = this, this == paVar4)) break;
    }
  }
  local_40.type_ = whitespace;
  (__return_storage_ptr__->first).type_ = eof;
  token::operator=(&__return_storage_ptr__->first,&local_40);
  __return_storage_ptr__->second = (unsigned_long)paVar5;
  token::destroy(&local_40);
  return extraout_RAX;
}

Assistant:

std::pair<token, size_t> skip_comment(const std::wstring_view& text, size_t pos, version v) {
    assert(pos < text.size());
    assert(text[pos] == '/' || text[pos] == '*');
    const bool is_single_line = text[pos++] == '/';
    if (is_single_line) {
        for (; pos < text.size(); ++pos) {
            if (is_line_terminator(text[pos], v)) {
                // Don't consume line terminator
                break;
            }
        }
        return {token{token_type::whitespace}, pos};
    } else {
        for (bool last_was_asterisk = false, line_terminator_seen = false; pos < text.size(); ++pos) {
            if (text[pos] == '/' && last_was_asterisk) {
                return {token{line_terminator_seen ? token_type::line_terminator : token_type::whitespace}, ++pos};
            }
            last_was_asterisk = text[pos] == '*';
            if (is_line_terminator(text[pos], v)) {
                line_terminator_seen = true;
            }
        }
        throw std::runtime_error("Unterminated multi-line comment");
    }
}